

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

ostream * PyreNet::operator<<(ostream *os,Layer *l)

{
  Layer *pLVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  size_type sVar5;
  reference p_00;
  activationType activation;
  Perceptron *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *__range1;
  string local_38;
  Layer *local_18;
  Layer *l_local;
  ostream *os_local;
  
  local_18 = l;
  l_local = (Layer *)os;
  uVar3 = (*l->activation->_vptr_Activation[1])();
  ActivationFactory::toString_abi_cxx11_(&local_38,(ActivationFactory *)(ulong)uVar3,activation);
  poVar4 = std::operator<<(os,(string *)&local_38);
  std::operator<<(poVar4," ");
  std::__cxx11::string::~string((string *)&local_38);
  pLVar1 = l_local;
  sVar5 = std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::size
                    (&local_18->nodes);
  poVar4 = (ostream *)std::ostream::operator<<(pLVar1,sVar5);
  std::operator<<(poVar4," ");
  pLVar1 = local_18;
  __end1 = std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::begin
                     (&local_18->nodes);
  p = (Perceptron *)
      std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::end(&pLVar1->nodes);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
                                *)&p);
    if (!bVar2) break;
    p_00 = __gnu_cxx::
           __normal_iterator<const_PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
           ::operator*(&__end1);
    poVar4 = operator<<((ostream *)l_local,p_00);
    std::operator<<(poVar4," ");
    __gnu_cxx::
    __normal_iterator<const_PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
    ::operator++(&__end1);
  }
  return (ostream *)l_local;
}

Assistant:

std::ostream &operator<<(std::ostream& os, const Layer &l) {
        os << ActivationFactory::toString(l.activation->type()) << " ";
        os << l.nodes.size() << " ";
        for (const Perceptron& p : l.nodes)
            os << p << " ";
        return os;
    }